

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void audit_regressor_lda(audit_regressor_data *rd,single_learner *param_2,example *ec)

{
  ulong uVar1;
  byte *pbVar2;
  uint32_t uVar3;
  uchar **ppuVar4;
  size_t sVar5;
  ostream *poVar6;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var7;
  element_type *peVar8;
  unsigned_long *puVar9;
  v_array<unsigned_char> *in_RDX;
  long *in_RDI;
  weight *w;
  size_t k;
  size_t j;
  features *fs;
  uchar *i;
  parameters *weights;
  ostringstream tempstream;
  vw *all;
  parameters *in_stack_fffffffffffffd38;
  size_t in_stack_fffffffffffffd40;
  parameters *in_stack_fffffffffffffd48;
  char *data;
  io_buf *in_stack_fffffffffffffd50;
  string local_218 [32];
  string local_1f8 [32];
  float *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  long local_1c0;
  byte *local_1a8;
  long local_1a0;
  ostream local_198;
  long local_20;
  v_array<unsigned_char> *local_18;
  long *local_8;
  
  local_20 = *in_RDI;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  local_1a0 = *local_8 + 0x3590;
  ppuVar4 = v_array<unsigned_char>::begin(local_18);
  local_1a8 = *ppuVar4;
  while( true ) {
    pbVar2 = local_1a8;
    ppuVar4 = v_array<unsigned_char>::end(local_18);
    if (pbVar2 == *ppuVar4) break;
    local_1c0 = (long)local_18 + (ulong)*local_1a8 * 0x68 + 0x20;
    local_1c8 = 0;
    while( true ) {
      uVar1 = local_1c8;
      sVar5 = features::size((features *)0x3d06a1);
      if (sVar5 <= uVar1) break;
      poVar6 = std::operator<<(&local_198,'\t');
      p_Var7 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(local_1c0 + 0x40),local_1c8)->
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar8 = std::
               __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ::get(p_Var7);
      poVar6 = std::operator<<(poVar6,(string *)peVar8);
      poVar6 = std::operator<<(poVar6,'^');
      p_Var7 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(local_1c0 + 0x40),local_1c8)->
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar8 = std::
               __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ::get(p_Var7);
      poVar6 = std::operator<<(poVar6,(string *)&peVar8->second);
      poVar6 = std::operator<<(poVar6,':');
      puVar9 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(local_1c0 + 0x20),local_1c8);
      uVar1 = *puVar9;
      uVar3 = parameters::stride_shift(in_stack_fffffffffffffd38);
      std::ostream::operator<<(poVar6,uVar1 >> ((byte)uVar3 & 0x3f) & *(ulong *)(local_20 + 0x358));
      for (local_1d0 = 0; local_1d0 < *(uint *)(local_20 + 0x3478); local_1d0 = local_1d0 + 1) {
        v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(local_1c0 + 0x20),local_1c8);
        local_1d8 = parameters::operator[](in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd50 = (io_buf *)std::operator<<(&local_198,':');
        std::ostream::operator<<(in_stack_fffffffffffffd50,*local_1d8);
        *local_1d8 = 0.0;
      }
      std::ostream::operator<<(&local_198,std::endl<char,std::char_traits<char>>);
      local_1c8 = local_1c8 + 1;
    }
    local_1a8 = local_1a8 + 1;
  }
  data = (char *)local_8[5];
  std::__cxx11::ostringstream::str();
  sVar5 = std::__cxx11::string::c_str();
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::size();
  io_buf::bin_write_fixed(in_stack_fffffffffffffd50,data,sVar5);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return;
}

Assistant:

void audit_regressor_lda(audit_regressor_data& rd, LEARNER::single_learner& /* base */, example& ec)
{
  vw& all = *rd.all;

  ostringstream tempstream;
  parameters& weights = rd.all->weights;
  for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); i++)
  {
    features& fs = ec.feature_space[*i];
    for (size_t j = 0; j < fs.size(); ++j)
    {
      tempstream << '\t' << fs.space_names[j].get()->first << '^' << fs.space_names[j].get()->second << ':'
                 << ((fs.indicies[j] >> weights.stride_shift()) & all.parse_mask);
      for (size_t k = 0; k < all.lda; k++)
      {
        weight& w = weights[(fs.indicies[j] + k)];
        tempstream << ':' << w;
        w = 0.;
      }
      tempstream << endl;
    }
  }

  rd.out_file->bin_write_fixed(tempstream.str().c_str(), (uint32_t)tempstream.str().size());
}